

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

char * google::protobuf::internal::WireFormat::_InternalParseAndMergeField
                 (Message *msg,char *ptr,ParseContext *ctx,uint64_t tag,Reflection *reflection,
                 FieldDescriptor *field)

{
  byte bVar1;
  ushort uVar2;
  MessageFactory *factory;
  anon_class_32_4_91646d40 add;
  bool bVar3;
  bool bVar4;
  int i;
  int32_t value_00;
  int iVar5;
  CppStringType CVar6;
  MessageLite *msg_00;
  RepeatedField<double> *object;
  UnknownFieldSet *pUVar7;
  char *pcVar8;
  int64_t value_01;
  long lVar9;
  Descriptor *this;
  FieldDescriptor *pFVar10;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar11;
  RepeatedField<long> *pRVar12;
  RepeatedField<unsigned_int> *pRVar13;
  RepeatedField<bool> *object_00;
  RepeatedField<float> *object_01;
  RepeatedField<unsigned_long> *pRVar14;
  RepeatedField<int> *pRVar15;
  undefined8 extraout_RAX;
  byte bVar16;
  uint32_t res;
  _Alloc_hider _Var17;
  uint uVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  Metadata MVar20;
  pair<const_char_*,_int> pVar21;
  pair<const_char_*,_unsigned_long> pVar22;
  pair<const_char_*,_unsigned_long> pVar23;
  pair<const_char_*,_unsigned_long> pVar24;
  pair<const_char_*,_unsigned_int> pVar25;
  string_view field_name;
  string_view field_name_00;
  string value;
  char *local_c0;
  anon_union_16_2_39e9c77e_for_Rep_0 local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  double local_98;
  string local_90;
  string local_70;
  RepeatedField<int> *local_50;
  FieldDescriptor *pFStack_48;
  Reflection *local_40;
  Message *pMStack_38;
  
  local_c0 = ptr;
  if (field == (FieldDescriptor *)0x0) {
LAB_0030c375:
    pUVar7 = Reflection::MutableUnknownFields(reflection,msg);
    pcVar8 = UnknownFieldParse(tag,pUVar7,ptr,ctx);
    return pcVar8;
  }
  uVar18 = (uint)tag & 7;
  bVar1 = field->type_;
  if (uVar18 != *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)bVar1 * 4)) {
    bVar16 = field->field_0x1 & 0x20;
    if (0xbf < (byte)field->field_0x1 != (bool)(bVar16 >> 5)) {
      _InternalParseAndMergeField();
LAB_0030cf29:
      _InternalParseAndMergeField();
LAB_0030cf3e:
      _InternalParseAndMergeField((WireFormat *)&local_b8.as_tree);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.as_tree.cordz_info != &local_a8) {
        operator_delete((void *)local_b8.as_tree.cordz_info,
                        CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1)
        ;
      }
      _Unwind_Resume(extraout_RAX);
    }
    if (((uVar18 != 2) || (bVar16 == 0)) || (0xfffffffb < bVar1 - 0xd)) goto LAB_0030c375;
    switch(bVar1) {
    case 1:
      object = Reflection::MutableRepeatedFieldInternal<double>(reflection,msg,field);
      pcVar8 = PackedDoubleParser(object,ptr,ctx);
      return pcVar8;
    case 2:
      object_01 = Reflection::MutableRepeatedFieldInternal<float>(reflection,msg,field);
      pcVar8 = PackedFloatParser(object_01,ptr,ctx);
      return pcVar8;
    case 3:
      pRVar12 = Reflection::MutableRepeatedFieldInternal<long>(reflection,msg,field);
      pcVar8 = PackedInt64Parser(pRVar12,ptr,ctx);
      return pcVar8;
    case 4:
      pRVar14 = Reflection::MutableRepeatedFieldInternal<unsigned_long>(reflection,msg,field);
      pcVar8 = PackedUInt64Parser(pRVar14,ptr,ctx);
      return pcVar8;
    case 5:
      pRVar15 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      pcVar8 = PackedInt32Parser(pRVar15,ptr,ctx);
      return pcVar8;
    case 6:
      pRVar14 = Reflection::MutableRepeatedFieldInternal<unsigned_long>(reflection,msg,field);
      pcVar8 = PackedFixed64Parser(pRVar14,ptr,ctx);
      return pcVar8;
    case 7:
      pRVar13 = Reflection::MutableRepeatedFieldInternal<unsigned_int>(reflection,msg,field);
      pcVar8 = PackedFixed32Parser(pRVar13,ptr,ctx);
      return pcVar8;
    case 8:
      object_00 = Reflection::MutableRepeatedFieldInternal<bool>(reflection,msg,field);
      pcVar8 = PackedBoolParser(object_00,ptr,ctx);
      return pcVar8;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_b8.as_tree,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
                 ,0x378);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                ((LogMessage *)&local_b8.as_tree,(char (*) [12])"Can\'t reach");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_b8.as_tree);
    case 0xd:
      pRVar13 = Reflection::MutableRepeatedFieldInternal<unsigned_int>(reflection,msg,field);
      pcVar8 = PackedUInt32Parser(pRVar13,ptr,ctx);
      return pcVar8;
    case 0xe:
      pRVar15 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      bVar4 = FieldDescriptor::legacy_enum_field_treated_as_closed(field);
      if (bVar4) {
        add.field = field;
        add.rep_enum = pRVar15;
        add.reflection = reflection;
        add.msg = msg;
        local_50 = pRVar15;
        pFStack_48 = field;
        local_40 = reflection;
        pMStack_38 = msg;
        pcVar8 = EpsCopyInputStream::
                 ReadPackedVarint<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                           (&ctx->super_EpsCopyInputStream,ptr,add);
        return pcVar8;
      }
      pcVar8 = PackedEnumParser(pRVar15,ptr,ctx);
      return pcVar8;
    case 0xf:
      pRVar15 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      pcVar8 = PackedSFixed32Parser(pRVar15,ptr,ctx);
      return pcVar8;
    case 0x10:
      pRVar12 = Reflection::MutableRepeatedFieldInternal<long>(reflection,msg,field);
      pcVar8 = PackedSFixed64Parser(pRVar12,ptr,ctx);
      return pcVar8;
    case 0x11:
      pRVar15 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      pcVar8 = PackedSInt32Parser(pRVar15,ptr,ctx);
      return pcVar8;
    case 0x12:
      pRVar12 = Reflection::MutableRepeatedFieldInternal<long>(reflection,msg,field);
      pcVar8 = PackedSInt64Parser(pRVar12,ptr,ctx);
      return pcVar8;
    }
    goto switchD_0030c2af_default;
  }
  bVar4 = false;
  pFVar10 = field;
  switch(bVar1) {
  case 1:
    local_98 = *(double *)ptr;
    pcVar8 = ptr + 8;
    bVar4 = FieldDescriptor::is_repeated(field);
    if (bVar4) {
      Reflection::AddDouble(reflection,msg,field,local_98);
    }
    else {
      Reflection::SetDouble(reflection,msg,field,local_98);
    }
    break;
  case 2:
    local_98 = (double)CONCAT44(local_98._4_4_,*(undefined4 *)ptr);
    pcVar8 = ptr + 4;
    bVar4 = FieldDescriptor::is_repeated(field);
    if (bVar4) {
      Reflection::AddFloat(reflection,msg,field,local_98._0_4_);
    }
    else {
      Reflection::SetFloat(reflection,msg,field,local_98._0_4_);
    }
    break;
  case 3:
    lVar9 = 0;
    do {
      lVar9 = lVar9 + 1;
    } while (lVar9 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar22 = VarintParseSlow64(ptr,(uint)bVar1);
      if (pVar22.first == (char *)0x0) goto switchD_0030c2af_default;
    }
    else {
      pVar22.second = (long)(char)bVar1;
      pVar22.first = ptr + 1;
    }
    goto LAB_0030c4a6;
  case 4:
    lVar9 = 0;
    do {
      lVar9 = lVar9 + 1;
    } while (lVar9 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar23 = VarintParseSlow64(ptr,(uint)bVar1);
      if (pVar23.first == (char *)0x0) goto switchD_0030c2af_default;
    }
    else {
      pVar23.second = (long)(char)bVar1;
      pVar23.first = ptr + 1;
    }
    goto LAB_0030c5b4;
  case 5:
    lVar9 = 0;
    do {
      lVar9 = lVar9 + 1;
    } while (lVar9 != 10);
    uVar18 = (uint)(byte)*ptr;
    if (*ptr < '\0') {
      pVar25 = VarintParseSlow32(ptr,uVar18);
      pcVar8 = pVar25.first;
      if (pcVar8 == (char *)0x0) goto switchD_0030c2af_default;
      uVar18 = pVar25.second;
    }
    else {
      pcVar8 = ptr + 1;
    }
    bVar4 = FieldDescriptor::is_repeated(field);
    if (bVar4) {
LAB_0030cbd2:
      Reflection::AddInt32(reflection,msg,field,uVar18);
      return pcVar8;
    }
    goto LAB_0030cbe9;
  case 6:
    pVar23.second = *(unsigned_long *)ptr;
    pVar23.first = ptr + 8;
LAB_0030c5b4:
    pcVar8 = pVar23.first;
    bVar4 = FieldDescriptor::is_repeated(field);
    if (bVar4) {
      Reflection::AddUInt64(reflection,msg,field,pVar23.second);
    }
    else {
      Reflection::SetUInt64(reflection,msg,field,pVar23.second);
    }
    break;
  case 7:
    res = *(uint32_t *)ptr;
    pcVar8 = ptr + 4;
    bVar4 = FieldDescriptor::is_repeated(field);
    if (bVar4) goto LAB_0030cc24;
    goto LAB_0030cc3b;
  case 8:
    lVar9 = 0;
    do {
      lVar9 = lVar9 + 1;
    } while (lVar9 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar24 = VarintParseSlow64(ptr,(uint)bVar1);
      if (pVar24.first == (char *)0x0) goto switchD_0030c2af_default;
    }
    else {
      pVar24.second = (long)(char)bVar1;
      pVar24.first = ptr + 1;
    }
    pcVar8 = pVar24.first;
    bVar4 = FieldDescriptor::is_repeated(field);
    if (bVar4) {
      Reflection::AddBool(reflection,msg,field,pVar24.second != 0);
    }
    else {
      Reflection::SetBool(reflection,msg,field,pVar24.second != 0);
    }
    break;
  case 9:
    bVar4 = FieldDescriptor::requires_utf8_validation(field);
    bVar3 = true;
    goto LAB_0030c611;
  case 10:
  case 0xb:
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) goto LAB_0030cf29;
    factory = (ctx->data_).factory;
    if ((bVar1 & 0x20) == 0) {
      msg_00 = &Reflection::MutableMessage(reflection,msg,field,factory)->super_MessageLite;
    }
    else {
      msg_00 = &Reflection::AddMessage(reflection,msg,field,factory)->super_MessageLite;
    }
    if (uVar18 == 3) {
      pcVar8 = ParseContext::ParseGroup(ctx,msg_00,ptr,(uint)tag);
      return pcVar8;
    }
    if (uVar18 != 2) goto LAB_0030cf3e;
    pcVar8 = ParseContext::ParseMessage(ctx,msg_00,ptr);
    if (pcVar8 != (char *)0x0) {
      if (field->type_ != '\v') {
        return pcVar8;
      }
      bVar4 = FieldDescriptor::is_map_message_type(field);
      if (!bVar4) {
        return pcVar8;
      }
      this = FieldDescriptor::message_type(field);
      pFVar10 = Descriptor::map_value(this);
      this_00 = FieldDescriptor::enum_type(pFVar10);
      if (this_00 == (EnumDescriptor *)0x0) {
        return pcVar8;
      }
      bVar4 = cpp::HasPreservingUnknownEnumSemantics(pFVar10);
      if (bVar4) {
        return pcVar8;
      }
      MVar20 = Message::GetMetadata((Message *)msg_00);
      iVar5 = Reflection::GetEnumValue(MVar20.reflection,(Message *)msg_00,pFVar10);
      pEVar11 = EnumDescriptor::FindValueByNumber(this_00,iVar5);
      if (pEVar11 != (EnumValueDescriptor *)0x0) {
        return pcVar8;
      }
      pUVar7 = Reflection::MutableUnknownFields(reflection,msg);
      iVar5 = field->number_;
      MessageLite::SerializeAsString_abi_cxx11_((string *)&local_b8.as_tree,msg_00);
      UnknownFieldSet::AddLengthDelimited<>(pUVar7,iVar5,(string *)&local_b8.as_tree);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.as_tree.cordz_info != &local_a8) {
        operator_delete((void *)local_b8.as_tree.cordz_info,
                        CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1)
        ;
      }
      Reflection::RemoveLast(reflection,msg,field);
      return pcVar8;
    }
  default:
switchD_0030c2af_default:
    pcVar8 = (char *)0x0;
    break;
  case 0xc:
    bVar3 = false;
LAB_0030c611:
    bVar1 = *ptr;
    uVar18 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      pVar21 = ReadSizeFallback(ptr,(uint)bVar1);
      pcVar8 = pVar21.first;
      if (pcVar8 == (char *)0x0) goto switchD_0030c2af_default;
      uVar18 = pVar21.second;
    }
    else {
      pcVar8 = ptr + 1;
    }
    local_c0 = pcVar8;
    CVar6 = FieldDescriptor::cpp_string_type(field);
    if (CVar6 == kCord) {
      local_b8.as_tree.cordz_info = 0;
      local_b8.as_tree.rep = (CordRep *)0x0;
      local_c0 = EpsCopyInputStream::ReadCord
                           (&ctx->super_EpsCopyInputStream,pcVar8,uVar18,(Cord *)&local_b8.as_tree);
      if (local_c0 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        Reflection::SetString(reflection,msg,field,(Cord *)&local_b8.as_tree);
        pcVar8 = local_c0;
      }
      absl::lts_20250127::Cord::~Cord((Cord *)&local_b8.as_tree);
      return pcVar8;
    }
    local_b8.as_tree.cordz_info = (cordz_info_t)&local_a8;
    local_b8.as_tree.rep = (CordRep *)0x0;
    local_a8._M_local_buf[0] = '\0';
    local_c0 = EpsCopyInputStream::ReadString
                         (&ctx->super_EpsCopyInputStream,pcVar8,uVar18,(string *)&local_b8.as_tree);
    if (local_c0 == (char *)0x0) {
LAB_0030c89c:
      pcVar8 = (char *)0x0;
    }
    else {
      if (bVar3) {
        pcVar8 = (field->all_names_).payload_;
        uVar2 = *(ushort *)(pcVar8 + 2);
        field_name._M_len = pcVar8 + ~(ulong)uVar2;
        if (bVar4 == false) {
          field_name_00._M_str = (char *)pFVar10;
          field_name_00._M_len = (size_t)field_name._M_len;
          WireFormatLite::VerifyUtf8String
                    ((WireFormatLite *)local_b8.as_tree.cordz_info,
                     (char *)((ulong)local_b8.as_tree.rep & 0xffffffff),0,(uint)uVar2,field_name_00)
          ;
        }
        else {
          field_name._M_str = (char *)pFVar10;
          bVar4 = WireFormatLite::VerifyUtf8String
                            ((WireFormatLite *)local_b8.as_tree.cordz_info,
                             (char *)((ulong)local_b8.as_tree.rep & 0xffffffff),0,(uint)uVar2,
                             field_name);
          if (!bVar4) goto LAB_0030c89c;
        }
      }
      bVar4 = FieldDescriptor::is_repeated(field);
      if (bVar4) {
        paVar19 = &local_70.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8.as_tree.cordz_info == &local_a8) {
          local_70.field_2._8_8_ = local_a8._8_8_;
          local_70._M_dataplus._M_p = (pointer)paVar19;
        }
        else {
          local_70._M_dataplus._M_p = (pointer)local_b8.as_tree.cordz_info;
        }
        local_70.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
        local_70.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
        local_70._M_string_length = (size_type)local_b8.as_tree.rep;
        local_b8.as_tree.rep = (CordRep *)0x0;
        local_a8._M_local_buf[0] = '\0';
        local_b8.as_tree.cordz_info = (cordz_info_t)&local_a8;
        Reflection::AddString(reflection,msg,field,&local_70);
        _Var17._M_p = local_70._M_dataplus._M_p;
      }
      else {
        paVar19 = &local_90.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8.as_tree.cordz_info == &local_a8) {
          local_90.field_2._8_8_ = local_a8._8_8_;
          local_90._M_dataplus._M_p = (pointer)paVar19;
        }
        else {
          local_90._M_dataplus._M_p = (pointer)local_b8.as_tree.cordz_info;
        }
        local_90.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
        local_90.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
        local_90._M_string_length = (size_type)local_b8.as_tree.rep;
        local_b8.as_tree.rep = (CordRep *)0x0;
        local_a8._M_local_buf[0] = '\0';
        local_b8.as_tree.cordz_info = (cordz_info_t)&local_a8;
        Reflection::SetString(reflection,msg,field,&local_90);
        _Var17._M_p = local_90._M_dataplus._M_p;
      }
      pcVar8 = local_c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var17._M_p != paVar19) {
        operator_delete(_Var17._M_p,paVar19->_M_allocated_capacity + 1);
        pcVar8 = local_c0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.as_tree.cordz_info != &local_a8) {
      operator_delete((void *)local_b8.as_tree.cordz_info,
                      CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
    }
    break;
  case 0xd:
    lVar9 = 0;
    do {
      lVar9 = lVar9 + 1;
    } while (lVar9 != 10);
    res = (uint32_t)(byte)*ptr;
    if (*ptr < '\0') {
      pVar25 = VarintParseSlow32(ptr,res);
      pcVar8 = pVar25.first;
      if (pcVar8 == (char *)0x0) goto switchD_0030c2af_default;
      res = pVar25.second;
    }
    else {
      pcVar8 = ptr + 1;
    }
    bVar4 = FieldDescriptor::is_repeated(field);
    if (bVar4) {
LAB_0030cc24:
      Reflection::AddUInt32(reflection,msg,field,res);
      return pcVar8;
    }
LAB_0030cc3b:
    Reflection::SetUInt32(reflection,msg,field,res);
    break;
  case 0xe:
    lVar9 = 0;
    do {
      lVar9 = lVar9 + 1;
    } while (lVar9 != 10);
    bVar1 = *ptr;
    uVar18 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      pVar25 = VarintParseSlow32(ptr,(uint)bVar1);
      pcVar8 = pVar25.first;
      if (pcVar8 == (char *)0x0) goto switchD_0030c2af_default;
      uVar18 = pVar25.second;
    }
    else {
      pcVar8 = ptr + 1;
    }
    bVar4 = FieldDescriptor::is_repeated(field);
    if (bVar4) {
      Reflection::AddEnumValue(reflection,msg,field,uVar18);
    }
    else {
      Reflection::SetEnumValue(reflection,msg,field,uVar18);
    }
    break;
  case 0xf:
    uVar18 = *(uint *)ptr;
    pcVar8 = ptr + 4;
    bVar4 = FieldDescriptor::is_repeated(field);
    if (bVar4) goto LAB_0030cbd2;
LAB_0030cbe9:
    Reflection::SetInt32(reflection,msg,field,uVar18);
    break;
  case 0x10:
    pVar22.second = *(unsigned_long *)ptr;
    pVar22.first = ptr + 8;
LAB_0030c4a6:
    pcVar8 = pVar22.first;
    bVar4 = FieldDescriptor::is_repeated(field);
    if (bVar4) {
      Reflection::AddInt64(reflection,msg,field,pVar22.second);
    }
    else {
      Reflection::SetInt64(reflection,msg,field,pVar22.second);
    }
    break;
  case 0x11:
    value_00 = ReadVarintZigZag32(&local_c0);
    if (local_c0 != (char *)0x0) {
      bVar4 = FieldDescriptor::is_repeated(field);
      if (bVar4) {
        Reflection::AddInt32(reflection,msg,field,value_00);
        return local_c0;
      }
      Reflection::SetInt32(reflection,msg,field,value_00);
      return local_c0;
    }
    goto switchD_0030c2af_default;
  case 0x12:
    value_01 = ReadVarintZigZag64(&local_c0);
    if (local_c0 != (char *)0x0) {
      bVar4 = FieldDescriptor::is_repeated(field);
      if (bVar4) {
        Reflection::AddInt64(reflection,msg,field,value_01);
        return local_c0;
      }
      Reflection::SetInt64(reflection,msg,field,value_01);
      return local_c0;
    }
    goto switchD_0030c2af_default;
  }
  return pcVar8;
}

Assistant:

const char* WireFormat::_InternalParseAndMergeField(
    Message* msg, const char* ptr, internal::ParseContext* ctx, uint64_t tag,
    const Reflection* reflection, const FieldDescriptor* field) {
  if (field == nullptr) {
    // unknown field set parser takes 64bit tags, because message set type ids
    // span the full 32 bit range making the tag span [0, 2^35) range.
    return internal::UnknownFieldParse(
        tag, reflection->MutableUnknownFields(msg), ptr, ctx);
  }
  if (WireFormatLite::GetTagWireType(tag) !=
      WireTypeForFieldType(field->type())) {
    if (field->is_packable() && WireFormatLite::GetTagWireType(tag) ==
                                    WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                   \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    ptr = internal::Packed##CPPTYPE_METHOD##Parser(                         \
        reflection->MutableRepeatedFieldInternal<CPPTYPE>(msg, field), ptr, \
        ctx);                                                               \
    return ptr;                                                             \
  }

        HANDLE_PACKED_TYPE(INT32, int32_t, Int32)
        HANDLE_PACKED_TYPE(INT64, int64_t, Int64)
        HANDLE_PACKED_TYPE(SINT32, int32_t, SInt32)
        HANDLE_PACKED_TYPE(SINT64, int64_t, SInt64)
        HANDLE_PACKED_TYPE(UINT32, uint32_t, UInt32)
        HANDLE_PACKED_TYPE(UINT64, uint64_t, UInt64)

        HANDLE_PACKED_TYPE(FIXED32, uint32_t, Fixed32)
        HANDLE_PACKED_TYPE(FIXED64, uint64_t, Fixed64)
        HANDLE_PACKED_TYPE(SFIXED32, int32_t, SFixed32)
        HANDLE_PACKED_TYPE(SFIXED64, int64_t, SFixed64)

        HANDLE_PACKED_TYPE(FLOAT, float, Float)
        HANDLE_PACKED_TYPE(DOUBLE, double, Double)

        HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

        case FieldDescriptor::TYPE_ENUM: {
          auto rep_enum =
              reflection->MutableRepeatedFieldInternal<int>(msg, field);
          if (!field->legacy_enum_field_treated_as_closed()) {
            ptr = internal::PackedEnumParser(rep_enum, ptr, ctx);
          } else {
            return ctx->ReadPackedVarint(
                ptr, [rep_enum, field, reflection, msg](int32_t val) {
                  if (field->enum_type()->FindValueByNumber(val) != nullptr) {
                    rep_enum->Add(val);
                  } else {
                    WriteVarint(field->number(), val,
                                reflection->MutableUnknownFields(msg));
                  }
                });
          }
          return ptr;
        }

        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE:
        case FieldDescriptor::TYPE_BYTES:
          ABSL_LOG(FATAL) << "Can't reach";
          return nullptr;
      }
    } else {
      // mismatched wiretype;
      return internal::UnknownFieldParse(
          tag, reflection->MutableUnknownFields(msg), ptr, ctx);
    }
  }

  // Non-packed value
  bool utf8_check = false;
  bool strict_utf8_check = false;
  switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)        \
  case FieldDescriptor::TYPE_##TYPE: {                    \
    CPPTYPE value;                                        \
    ptr = VarintParse(ptr, &value);                       \
    if (ptr == nullptr) return nullptr;                   \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
    return ptr;                                           \
  }

    HANDLE_TYPE(BOOL, uint64_t, Bool)
    HANDLE_TYPE(INT32, uint32_t, Int32)
    HANDLE_TYPE(INT64, uint64_t, Int64)
    HANDLE_TYPE(UINT32, uint32_t, UInt32)
    HANDLE_TYPE(UINT64, uint64_t, UInt64)

    case FieldDescriptor::TYPE_SINT32: {
      int32_t value = ReadVarintZigZag32(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddInt32(msg, field, value);
      } else {
        reflection->SetInt32(msg, field, value);
      }
      return ptr;
    }
    case FieldDescriptor::TYPE_SINT64: {
      int64_t value = ReadVarintZigZag64(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddInt64(msg, field, value);
      } else {
        reflection->SetInt64(msg, field, value);
      }
      return ptr;
    }
#undef HANDLE_TYPE
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)        \
  case FieldDescriptor::TYPE_##TYPE: {                    \
    CPPTYPE value;                                        \
    value = UnalignedLoad<CPPTYPE>(ptr);                  \
    ptr += sizeof(CPPTYPE);                               \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
    return ptr;                                           \
  }

      HANDLE_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

#undef HANDLE_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      uint32_t value;
      ptr = VarintParse(ptr, &value);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddEnumValue(msg, field, value);
      } else {
        reflection->SetEnumValue(msg, field, value);
      }
      return ptr;
    }

    // Handle strings separately so that we can optimize the ctype=CORD case.
    case FieldDescriptor::TYPE_STRING:
      utf8_check = true;
      strict_utf8_check = field->requires_utf8_validation();
      ABSL_FALLTHROUGH_INTENDED;
    case FieldDescriptor::TYPE_BYTES: {
      int size = ReadSize(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
        absl::Cord value;
        ptr = ctx->ReadCord(ptr, size, &value);
        if (ptr == nullptr) return nullptr;
        reflection->SetString(msg, field, value);
        return ptr;
      }
      std::string value;
      ptr = ctx->ReadString(ptr, size, &value);
      if (ptr == nullptr) return nullptr;
      if (utf8_check) {
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name())) {
            return nullptr;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name());
        }
      }
      if (field->is_repeated()) {
        reflection->AddString(msg, field, std::move(value));
      } else {
        reflection->SetString(msg, field, std::move(value));
      }
      return ptr;
    }

    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      return HandleMessage(msg, ptr, ctx, tag, reflection, field);
  }

  // GCC 8 complains about control reaching end of non-void function here.
  // Let's keep it happy by returning a nullptr.
  return nullptr;
}